

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableView::columnResized(QTableView *this,int column,int param_3,int param_4)

{
  bool bVar1;
  QTableViewPrivate *pQVar2;
  nanoseconds duration;
  QTableViewPrivate *d;
  undefined8 in_stack_ffffffffffffffc8;
  parameter_type t;
  QBasicTimer *this_00;
  
  t = (parameter_type)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  pQVar2 = d_func((QTableView *)0x8b6108);
  QList<int>::append((QList<int> *)0x8b6122,t);
  bVar1 = QBasicTimer::isActive(&pQVar2->columnResizeTimer);
  if (!bVar1) {
    this_00 = &pQVar2->columnResizeTimer;
    duration = ns<(char)48>();
    QBasicTimer::start(this_00,(Duration)duration.__r,(QObject *)0x8b6163);
  }
  return;
}

Assistant:

void QTableView::columnResized(int column, int, int)
{
    Q_D(QTableView);
    d->columnsToUpdate.append(column);
    if (!d->columnResizeTimer.isActive())
        d->columnResizeTimer.start(0ns, this);
}